

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O3

HairMaterial *
pbrt::HairMaterial::Create(TextureParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  RGBSigmoidPolynomial *pRVar1;
  int iVar2;
  uintptr_t iptr_1;
  undefined4 extraout_var;
  undefined8 *puVar4;
  undefined4 extraout_var_01;
  char *message;
  uintptr_t iptr;
  FloatTextureHandle pheomelanin;
  FloatTextureHandle eumelanin;
  SpectrumTextureHandle sigma_a;
  SpectrumTextureHandle color;
  FloatTextureHandle alpha;
  FloatTextureHandle beta_n;
  FloatTextureHandle beta_m;
  FloatTextureHandle eta;
  RGBSpectrum local_90;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  ParameterDictionary *local_38;
  ParameterDictionary *local_30;
  HairMaterial *pHVar3;
  undefined4 extraout_var_00;
  
  pRVar1 = &local_90.rsp;
  local_90.rgb._0_8_ = pRVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"sigma_a","");
  TextureParameterDictionary::GetSpectrumTextureOrNull
            ((TextureParameterDictionary *)local_58,(string *)parameters,(SpectrumType)&local_90,
             (Allocator)0x1);
  if ((RGBSigmoidPolynomial *)local_90.rgb._0_8_ != pRVar1) {
    operator_delete((void *)local_90.rgb._0_8_,local_90.rsp._0_8_ + 1);
  }
  local_90.rgb._0_8_ = pRVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"color","");
  TextureParameterDictionary::GetSpectrumTextureOrNull
            ((TextureParameterDictionary *)(local_58 + 8),(string *)parameters,
             (SpectrumType)&local_90,(Allocator)0x0);
  if ((RGBSigmoidPolynomial *)local_90.rgb._0_8_ != pRVar1) {
    operator_delete((void *)local_90.rgb._0_8_,local_90.rsp._0_8_ + 1);
  }
  local_90.rgb._0_8_ = pRVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"eumelanin","");
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)(local_68 + 8),(string *)parameters,
             (memory_resource *)&local_90);
  if ((RGBSigmoidPolynomial *)local_90.rgb._0_8_ != pRVar1) {
    operator_delete((void *)local_90.rgb._0_8_,local_90.rsp._0_8_ + 1);
  }
  local_90.rgb._0_8_ = pRVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"pheomelanin","");
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)local_68,(string *)parameters,
             (memory_resource *)&local_90);
  if ((RGBSigmoidPolynomial *)local_90.rgb._0_8_ != pRVar1) {
    operator_delete((void *)local_90.rgb._0_8_,local_90.rsp._0_8_ + 1);
  }
  if ((local_58._0_8_ & 0xffffffffffff) == 0) {
    if ((local_58._8_8_ & 0xffffffffffff) == 0) {
      if (((local_68._8_8_ & 0xffffffffffff) == 0) && ((local_68._0_8_ & 0xffffffffffff) == 0)) {
        HairBxDF::SigmaAFromConcentration(&local_90,1.3,0.0);
        iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x28,8);
        puVar4 = (undefined8 *)CONCAT44(extraout_var_00,iVar2);
        *puVar4 = local_90.rgb._0_8_;
        puVar4[1] = local_90._8_8_;
        puVar4[2] = local_90.rsp._0_8_;
        puVar4[3] = local_90._24_8_;
        puVar4[4] = local_90.illuminant;
        iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,8,8);
        local_58._0_8_ = CONCAT44(extraout_var_01,iVar2) | 0x7000000000000;
        *(ulong *)CONCAT44(extraout_var_01,iVar2) = (ulong)puVar4 | 0x4000000000000;
      }
      goto LAB_0054a099;
    }
    if ((local_68._8_8_ & 0xffffffffffff) != 0) {
      Warning(loc,"Ignoring \"eumelanin\" parameter since \"color\" was provided.");
    }
    if ((local_68._0_8_ & 0xffffffffffff) == 0) goto LAB_0054a099;
    message = "Ignoring \"pheomelanin\" parameter since \"color\" was provided.";
  }
  else {
    if ((local_58._8_8_ & 0xffffffffffff) != 0) {
      Warning(loc,"Ignoring \"color\" parameter since \"sigma_a\" was provided.");
    }
    if ((local_68._8_8_ & 0xffffffffffff) != 0) {
      Warning(loc,"Ignoring \"eumelanin\" parameter since \"sigma_a\" was provided.");
    }
    if ((local_68._0_8_ & 0xffffffffffff) == 0) goto LAB_0054a099;
    message = "Ignoring \"pheomelanin\" parameter since \"sigma_a\" was provided.";
  }
  Warning(loc,message);
LAB_0054a099:
  local_90.rgb._0_8_ = pRVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"eta","");
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)&local_30,(string *)parameters,1.55,
             (memory_resource *)&local_90);
  if ((RGBSigmoidPolynomial *)local_90.rgb._0_8_ != pRVar1) {
    operator_delete((void *)local_90.rgb._0_8_,local_90.rsp._0_8_ + 1);
  }
  local_90.rgb._0_8_ = pRVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"beta_m","");
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)&local_38,(string *)parameters,0.3,
             (memory_resource *)&local_90);
  if ((RGBSigmoidPolynomial *)local_90.rgb._0_8_ != pRVar1) {
    operator_delete((void *)local_90.rgb._0_8_,local_90.rsp._0_8_ + 1);
  }
  local_90.rgb._0_8_ = pRVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"beta_n","");
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)(local_48 + 8),(string *)parameters,0.3,
             (memory_resource *)&local_90);
  if ((RGBSigmoidPolynomial *)local_90.rgb._0_8_ != pRVar1) {
    operator_delete((void *)local_90.rgb._0_8_,local_90.rsp._0_8_ + 1);
  }
  local_90.rgb._0_8_ = pRVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"alpha","");
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)local_48,(string *)parameters,2.0,
             (memory_resource *)&local_90);
  if ((RGBSigmoidPolynomial *)local_90.rgb._0_8_ != pRVar1) {
    operator_delete((void *)local_90.rgb._0_8_,local_90.rsp._0_8_ + 1);
  }
  iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x40,8);
  pHVar3 = (HairMaterial *)CONCAT44(extraout_var,iVar2);
  (pHVar3->sigma_a).
  super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  .bits = local_58._0_8_;
  (pHVar3->color).
  super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  .bits = local_58._8_8_;
  (pHVar3->eumelanin).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = local_68._8_8_;
  (pHVar3->pheomelanin).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = local_68._0_8_;
  (pHVar3->eta).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = (uintptr_t)local_30;
  (pHVar3->beta_m).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = (uintptr_t)local_38;
  (pHVar3->beta_n).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = local_48._8_8_;
  (pHVar3->alpha).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = local_48._0_8_;
  return pHVar3;
}

Assistant:

HairMaterial *HairMaterial::Create(const TextureParameterDictionary &parameters,
                                   const FileLoc *loc, Allocator alloc) {
    SpectrumTextureHandle sigma_a =
        parameters.GetSpectrumTextureOrNull("sigma_a", SpectrumType::General, alloc);
    SpectrumTextureHandle color =
        parameters.GetSpectrumTextureOrNull("color", SpectrumType::Reflectance, alloc);
    FloatTextureHandle eumelanin = parameters.GetFloatTextureOrNull("eumelanin", alloc);
    FloatTextureHandle pheomelanin =
        parameters.GetFloatTextureOrNull("pheomelanin", alloc);
    if (sigma_a) {
        if (color)
            Warning(loc, R"(Ignoring "color" parameter since "sigma_a" was provided.)");
        if (eumelanin)
            Warning(loc, "Ignoring \"eumelanin\" parameter since \"sigma_a\" was "
                         "provided.");
        if (pheomelanin)
            Warning(loc, "Ignoring \"pheomelanin\" parameter since \"sigma_a\" was "
                         "provided.");
    } else if (color) {
        if (sigma_a)
            Warning(loc, R"(Ignoring "sigma_a" parameter since "color" was provided.)");
        if (eumelanin)
            Warning(loc, "Ignoring \"eumelanin\" parameter since \"color\" was "
                         "provided.");
        if (pheomelanin)
            Warning(loc, "Ignoring \"pheomelanin\" parameter since \"color\" was "
                         "provided.");
    } else if (eumelanin || pheomelanin) {
        if (sigma_a)
            Warning(loc, "Ignoring \"sigma_a\" parameter since "
                         "\"eumelanin\"/\"pheomelanin\" was provided.");
        if (color)
            Warning(loc, "Ignoring \"color\" parameter since "
                         "\"eumelanin\"/\"pheomelanin\" was provided.");
    } else {
        // Default: brown-ish hair.
        sigma_a = alloc.new_object<SpectrumConstantTexture>(
            alloc.new_object<RGBSpectrum>(HairBxDF::SigmaAFromConcentration(1.3, 0.)));
    }

    FloatTextureHandle eta = parameters.GetFloatTexture("eta", 1.55f, alloc);
    FloatTextureHandle beta_m = parameters.GetFloatTexture("beta_m", 0.3f, alloc);
    FloatTextureHandle beta_n = parameters.GetFloatTexture("beta_n", 0.3f, alloc);
    FloatTextureHandle alpha = parameters.GetFloatTexture("alpha", 2.f, alloc);

    return alloc.new_object<HairMaterial>(sigma_a, color, eumelanin, pheomelanin, eta,
                                          beta_m, beta_n, alpha);
}